

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.h
# Opt level: O1

void __thiscall QTable::QTable(QTable *this,QTable *a)

{
  size_type __n;
  size_type sVar1;
  size_type sVar2;
  double *__dest;
  
  (this->super_QTableInterface)._vptr_QTableInterface =
       (_func_int **)&PTR___cxa_pure_virtual_0059e870;
  sVar2 = (a->super_matrix_t).size2_;
  (this->super_matrix_t).size1_ = (a->super_matrix_t).size1_;
  (this->super_matrix_t).size2_ = sVar2;
  __n = (a->super_matrix_t).data_.size_;
  (this->super_matrix_t).data_.size_ = __n;
  if (__n == 0) {
    (this->super_matrix_t).data_.data_ = (pointer)0x0;
  }
  else {
    __dest = __gnu_cxx::new_allocator<double>::allocate
                       ((new_allocator<double> *)&(this->super_matrix_t).data_,__n,(void *)0x0);
    (this->super_matrix_t).data_.data_ = __dest;
    sVar1 = (a->super_matrix_t).data_.size_;
    if (sVar1 != 0) {
      memmove(__dest,(a->super_matrix_t).data_.data_,sVar1 << 3);
    }
  }
  (this->super_QTableInterface)._vptr_QTableInterface = (_func_int **)&PTR_Get_005cdfc0;
  return;
}

Assistant:

QTable(const QTable& a)
        :   matrix_t(a)
        {}